

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

size_t wabt::ReadU64Leb128(uint8_t *p,uint8_t *end,uint64_t *out_value)

{
  uint64_t *out_value_local;
  uint8_t *end_local;
  uint8_t *p_local;
  
  if ((p < end) && ((*p & 0x80) == 0)) {
    *out_value = (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x1;
  }
  else if ((p + 1 < end) && ((p[1] & 0x80) == 0)) {
    *out_value = ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x2;
  }
  else if ((p + 2 < end) && ((p[2] & 0x80) == 0)) {
    *out_value = ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x3;
  }
  else if ((p + 3 < end) && ((p[3] & 0x80) == 0)) {
    *out_value = ((ulong)p[3] & 0x7f) << 0x15 |
                 ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x4;
  }
  else if ((p + 4 < end) && ((p[4] & 0x80) == 0)) {
    *out_value = ((ulong)p[4] & 0x7f) << 0x1c |
                 ((ulong)p[3] & 0x7f) << 0x15 |
                 ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x5;
  }
  else if ((p + 5 < end) && ((p[5] & 0x80) == 0)) {
    *out_value = ((ulong)p[5] & 0x7f) << 0x23 |
                 ((ulong)p[4] & 0x7f) << 0x1c |
                 ((ulong)p[3] & 0x7f) << 0x15 |
                 ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x6;
  }
  else if ((p + 6 < end) && ((p[6] & 0x80) == 0)) {
    *out_value = ((ulong)p[6] & 0x7f) << 0x2a |
                 ((ulong)p[5] & 0x7f) << 0x23 |
                 ((ulong)p[4] & 0x7f) << 0x1c |
                 ((ulong)p[3] & 0x7f) << 0x15 |
                 ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x7;
  }
  else if ((p + 7 < end) && ((p[7] & 0x80) == 0)) {
    *out_value = ((ulong)p[7] & 0x7f) << 0x31 |
                 ((ulong)p[6] & 0x7f) << 0x2a |
                 ((ulong)p[5] & 0x7f) << 0x23 |
                 ((ulong)p[4] & 0x7f) << 0x1c |
                 ((ulong)p[3] & 0x7f) << 0x15 |
                 ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x8;
  }
  else if ((p + 8 < end) && ((p[8] & 0x80) == 0)) {
    *out_value = ((ulong)p[8] & 0x7f) << 0x38 |
                 ((ulong)p[7] & 0x7f) << 0x31 |
                 ((ulong)p[6] & 0x7f) << 0x2a |
                 ((ulong)p[5] & 0x7f) << 0x23 |
                 ((ulong)p[4] & 0x7f) << 0x1c |
                 ((ulong)p[3] & 0x7f) << 0x15 |
                 ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
    p_local = (uint8_t *)0x9;
  }
  else if ((p + 9 < end) && ((p[9] & 0x80) == 0)) {
    if ((p[9] & 0xf0) == 0) {
      *out_value = (ulong)p[9] << 0x3f |
                   ((ulong)p[8] & 0x7f) << 0x38 |
                   ((ulong)p[7] & 0x7f) << 0x31 |
                   ((ulong)p[6] & 0x7f) << 0x2a |
                   ((ulong)p[5] & 0x7f) << 0x23 |
                   ((ulong)p[4] & 0x7f) << 0x1c |
                   ((ulong)p[3] & 0x7f) << 0x15 |
                   ((ulong)p[2] & 0x7f) << 0xe | ((ulong)p[1] & 0x7f) << 7 | (ulong)*p & 0x7f;
      p_local = (uint8_t *)0xa;
    }
    else {
      p_local = (uint8_t *)0x0;
    }
  }
  else {
    *out_value = 0;
    p_local = (uint8_t *)0x0;
  }
  return (size_t)p_local;
}

Assistant:

size_t ReadU64Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint64_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    *out_value = LEB128_1(uint64_t);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    *out_value = LEB128_2(uint64_t);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    *out_value = LEB128_3(uint64_t);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    *out_value = LEB128_4(uint64_t);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    *out_value = LEB128_5(uint64_t);
    return 5;
  } else if (p + 5 < end && (p[5] & 0x80) == 0) {
    *out_value = LEB128_6(uint64_t);
    return 6;
  } else if (p + 6 < end && (p[6] & 0x80) == 0) {
    *out_value = LEB128_7(uint64_t);
    return 7;
  } else if (p + 7 < end && (p[7] & 0x80) == 0) {
    *out_value = LEB128_8(uint64_t);
    return 8;
  } else if (p + 8 < end && (p[8] & 0x80) == 0) {
    *out_value = LEB128_9(uint64_t);
    return 9;
  } else if (p + 9 < end && (p[9] & 0x80) == 0) {
    // The top bits set represent values > 32 bits.
    if (p[9] & 0xf0) {
      return 0;
    }
    *out_value = LEB128_10(uint64_t);
    return 10;
  } else {
    // past the end.
    *out_value = 0;
    return 0;
  }
}